

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

parameter * __thiscall
clipp::option<char_const(&)[3]>(parameter *__return_storage_ptr__,clipp *this,char (*flag) [3])

{
  allocator local_131;
  arg_string local_130;
  parameter local_110;
  
  std::__cxx11::string::string((string *)&local_130,(char *)this,&local_131);
  parameter::parameter<>(&local_110,&local_130);
  local_110.required_ = false;
  local_110.super_token<clipp::parameter>.repeatable_ = false;
  local_110.super_token<clipp::parameter>.blocking_ = false;
  parameter::parameter(__return_storage_ptr__,&local_110);
  parameter::~parameter(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  return __return_storage_ptr__;
}

Assistant:

inline parameter
option(String&& flag, Strings&&... flags)
{
    return parameter{std::forward<String>(flag), std::forward<Strings>(flags)...}
        .required(false).blocking(false).repeatable(false);
}